

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

int tlsio_openssl_setoption(CONCRETE_IO_HANDLE tls_io,char *optionName,void *value)

{
  uint uVar1;
  int iVar2;
  OPTIONHANDLER_RESULT OVar3;
  void *pvVar4;
  LOGGER_LOG p_Var5;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar6;
  size_t local_c0;
  _Bool *server_name_check;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  int version_option;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  OPTION_OPENSSL_KEY_TYPE type;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t malloc_size;
  size_t len;
  char *cert;
  TLS_IO_INSTANCE *tls_io_instance;
  int result;
  void *value_local;
  char *optionName_local;
  CONCRETE_IO_HANDLE tls_io_local;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if ((tls_io == (CONCRETE_IO_HANDLE)0x0) || (optionName == (char *)0x0)) {
    return 0x66a;
  }
  iVar2 = strcmp("TrustedCerts",optionName);
  if (iVar2 != 0) {
    iVar2 = strcmp("CipherSuite",optionName);
    if (iVar2 == 0) {
      if (*(long *)((long)tls_io + 0x78) != 0) {
        free(*(void **)((long)tls_io + 0x78));
        *(undefined8 *)((long)tls_io + 0x78) = 0;
      }
      iVar2 = mallocAndStrcpy_s((char **)((long)tls_io + 0x78),(char *)value);
      if (iVar2 != 0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_setoption",0x69d,1,"unable to mallocAndStrcpy_s %s",optionName);
        }
        return 0x69e;
      }
      return 0;
    }
    iVar2 = strcmp("x509certificate",optionName);
    if ((iVar2 == 0) || (iVar2 = strcmp("x509EccCertificate",optionName), iVar2 == 0)) {
      if (*(long *)((long)tls_io + 0x80) != 0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_setoption",0x6a9,1,"unable to set x509 options more than once");
        }
        return 0x6aa;
      }
      iVar2 = mallocAndStrcpy_s((char **)((long)tls_io + 0x80),(char *)value);
      if (iVar2 != 0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_setoption",0x6b1,1,"unable to mallocAndStrcpy_s %s",optionName);
        }
        return 0x6b2;
      }
      return 0;
    }
    iVar2 = strcmp("x509privatekey",optionName);
    if ((iVar2 == 0) || (iVar2 = strcmp("x509EccAliasKey",optionName), iVar2 == 0)) {
      if (*(long *)((long)tls_io + 0x88) != 0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_setoption",0x6be,1,"unable to set more than once x509 options");
        }
        return 0x6bf;
      }
      iVar2 = mallocAndStrcpy_s((char **)((long)tls_io + 0x88),(char *)value);
      if (iVar2 != 0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_setoption",0x6c6,1,"unable to mallocAndStrcpy_s %s",optionName);
        }
        return 0x6c7;
      }
      return 0;
    }
    iVar2 = strcmp("Engine",optionName);
    if (iVar2 == 0) {
      ENGINE_load_builtin_engines();
      iVar2 = mallocAndStrcpy_s((char **)((long)tls_io + 0xb0),(char *)value);
      if (iVar2 != 0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_setoption",0x6d6,1,"unable to mallocAndStrcpy_s %s",optionName);
        }
        return 0x6d7;
      }
      return 0;
    }
    iVar2 = strcmp("x509PrivatekeyType",optionName);
    if (iVar2 == 0) {
      uVar1 = *value;
      if (uVar1 < 2) {
        *(uint *)((long)tls_io + 200) = uVar1;
        return 0;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                  ,"tlsio_openssl_setoption",0x6eb,1,"Unknown x509PrivatekeyType type %d",
                  CONCAT44(uVar6,uVar1));
      }
      return 0x6ec;
    }
    iVar2 = strcmp("tls_validation_callback",optionName);
    if (iVar2 == 0) {
      *(void **)((long)tls_io + 0x98) = value;
      if (*(long *)((long)tls_io + 0x50) != 0) {
        SSL_CTX_set_cert_verify_callback
                  (*(SSL_CTX **)((long)tls_io + 0x50),*(cb **)((long)tls_io + 0x98),
                   *(void **)((long)tls_io + 0xa0));
      }
      return 0;
    }
    iVar2 = strcmp("tls_validation_callback_data",optionName);
    if (iVar2 == 0) {
      *(void **)((long)tls_io + 0xa0) = value;
      if (*(long *)((long)tls_io + 0x50) != 0) {
        SSL_CTX_set_cert_verify_callback
                  (*(SSL_CTX **)((long)tls_io + 0x50),*(cb **)((long)tls_io + 0x98),
                   *(void **)((long)tls_io + 0xa0));
      }
      return 0;
    }
    iVar2 = strcmp("tls_version",optionName);
    if (iVar2 == 0) {
      if (*(long *)((long)tls_io + 0x50) != 0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_setoption",0x710,1,
                    "Unable to set the tls version after the tls connection is established");
        }
        return 0x711;
      }
      iVar2 = *value;
      if ((iVar2 == 0) || (iVar2 == 10)) {
        *(undefined4 *)((long)tls_io + 0x90) = 10;
      }
      else if (iVar2 == 0xb) {
        *(undefined4 *)((long)tls_io + 0x90) = 0xb;
      }
      else if (iVar2 == 0xc) {
        *(undefined4 *)((long)tls_io + 0x90) = 0xc;
      }
      else {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_setoption",0x724,1,
                    "Value of TLS version option %d is not found shall default to version 1.2",
                    CONCAT44(uVar6,iVar2));
        }
        *(undefined4 *)((long)tls_io + 0x90) = 0xc;
      }
      return 0;
    }
    iVar2 = strcmp(optionName,"underlying_io_options");
    if (iVar2 == 0) {
      OVar3 = OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value,*tls_io);
      if (OVar3 != OPTIONHANDLER_OK) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_setoption",0x72e,1,
                    "failed feeding options to underlying I/O instance");
        }
        return 0x72f;
      }
      return 0;
    }
    iVar2 = strcmp(optionName,"tls_renegotiation");
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = strcmp("ignore_host_name_check",optionName);
    if (iVar2 == 0) {
      *(byte *)((long)tls_io + 0xb8) = *value & 1;
      return 0;
    }
    if (*tls_io == 0) {
      return 0x745;
    }
    iVar2 = xio_setoption(*tls_io,optionName,value);
    return iVar2;
  }
  if (*(long *)((long)tls_io + 0x70) != 0) {
    free(*(void **)((long)tls_io + 0x70));
    *(undefined8 *)((long)tls_io + 0x70) = 0;
  }
  local_c0 = strlen((char *)value);
  if (local_c0 < 0xfffffffffffffffe) {
    local_c0 = local_c0 + 1;
  }
  else {
    local_c0 = 0xffffffffffffffff;
  }
  if (local_c0 != 0xffffffffffffffff) {
    pvVar4 = malloc(local_c0);
    *(void **)((long)tls_io + 0x70) = pvVar4;
    if (pvVar4 != (void *)0x0) {
      strcpy(*(char **)((long)tls_io + 0x70),(char *)value);
      tls_io_instance._4_4_ = 0;
      goto LAB_00152b04;
    }
  }
  p_Var5 = xlogging_get_log_function();
  if (p_Var5 != (LOGGER_LOG)0x0) {
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
              ,"tlsio_openssl_setoption",0x682,1,"malloc failure, size:%zu",local_c0);
  }
  tls_io_instance._4_4_ = 0x683;
LAB_00152b04:
  if (*(long *)((long)tls_io + 0x50) != 0) {
    tls_io_instance._4_4_ = add_certificate_to_store((TLS_IO_INSTANCE *)tls_io,(char *)value);
  }
  return tls_io_instance._4_4_;
}

Assistant:

int tlsio_openssl_setoption(CONCRETE_IO_HANDLE tls_io, const char* optionName, const void* value)
{
    int result;

    if (tls_io == NULL || optionName == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)tls_io;

        if (strcmp(OPTION_TRUSTED_CERT, optionName) == 0)
        {
            const char* cert = (const char*)value;
            size_t len;

            if (tls_io_instance->certificate != NULL)
            {
                // Free the memory if it has been previously allocated
                free(tls_io_instance->certificate);
                tls_io_instance->certificate = NULL;
            }

            // Store the certificate
            len = strlen(cert);
            size_t malloc_size = safe_add_size_t(len, 1);
            if (malloc_size == SIZE_MAX ||
                (tls_io_instance->certificate = malloc(malloc_size)) == NULL)
            {
                LogError("malloc failure, size:%zu", malloc_size);
                result = MU_FAILURE;
            }
            else
            {
                strcpy(tls_io_instance->certificate, cert);
                result = 0;
            }

            // If we're previously connected then add the cert to the context
            if (tls_io_instance->ssl_context != NULL)
            {
                result = add_certificate_to_store(tls_io_instance, cert);
            }
        }
        else if (strcmp(OPTION_OPENSSL_CIPHER_SUITE, optionName) == 0)
        {
            if (tls_io_instance->cipher_list != NULL)
            {
                // Free the memory if it has been previously allocated
                free(tls_io_instance->cipher_list);
                tls_io_instance->cipher_list = NULL;
            }

            // Store the cipher suites
            if (mallocAndStrcpy_s((char**)&tls_io_instance->cipher_list, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s %s", optionName);
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
        else if (strcmp(SU_OPTION_X509_CERT, optionName) == 0 || strcmp(OPTION_X509_ECC_CERT, optionName) == 0)
        {
            if (tls_io_instance->x509_certificate != NULL)
            {
                LogError("unable to set x509 options more than once");
                result = MU_FAILURE;
            }
            else
            {
                /*let's make a copy of this option*/
                if (mallocAndStrcpy_s((char**)&tls_io_instance->x509_certificate, value) != 0)
                {
                    LogError("unable to mallocAndStrcpy_s %s", optionName);
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
        }
        else if (strcmp(SU_OPTION_X509_PRIVATE_KEY, optionName) == 0 || strcmp(OPTION_X509_ECC_KEY, optionName) == 0)
        {
            if (tls_io_instance->x509_private_key != NULL)
            {
                LogError("unable to set more than once x509 options");
                result = MU_FAILURE;
            }
            else
            {
                /*let's make a copy of this option*/
                if (mallocAndStrcpy_s((char**)&tls_io_instance->x509_private_key, value) != 0)
                {
                    LogError("unable to mallocAndStrcpy_s %s", optionName);
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
        }
        #ifndef OPENSSL_NO_ENGINE
        else if (strcmp(OPTION_OPENSSL_ENGINE, optionName) == 0)
        {
            ENGINE_load_builtin_engines();

            if (mallocAndStrcpy_s((char**)&tls_io_instance->engine_id, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s %s", optionName);
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
        #endif // OPENSSL_NO_ENGINE
        else if (strcmp(OPTION_OPENSSL_PRIVATE_KEY_TYPE, optionName) == 0)
        {
            const OPTION_OPENSSL_KEY_TYPE type = *(const OPTION_OPENSSL_KEY_TYPE*)value;
            switch (type)
            {
            case KEY_TYPE_DEFAULT:
            case KEY_TYPE_ENGINE:
                tls_io_instance->x509_private_key_type = type;
                result = 0;
                break;

            default:
                LogError("Unknown x509PrivatekeyType type %d", type);
                result = MU_FAILURE;
            }
        }
        else if (strcmp("tls_validation_callback", optionName) == 0)
        {
#ifdef WIN32
#pragma warning(push)
#pragma warning(disable:4055)
#endif // WIN32
            tls_io_instance->tls_validation_callback = (TLS_CERTIFICATE_VALIDATION_CALLBACK)value;
#ifdef WIN32
#pragma warning(pop)
#endif // WIN32

            if (tls_io_instance->ssl_context != NULL)
            {
                SSL_CTX_set_cert_verify_callback(tls_io_instance->ssl_context, tls_io_instance->tls_validation_callback, tls_io_instance->tls_validation_callback_data);
            }

            result = 0;
        }
        else if (strcmp("tls_validation_callback_data", optionName) == 0)
        {
            tls_io_instance->tls_validation_callback_data = (void*)value;

            if (tls_io_instance->ssl_context != NULL)
            {
                SSL_CTX_set_cert_verify_callback(tls_io_instance->ssl_context, tls_io_instance->tls_validation_callback, tls_io_instance->tls_validation_callback_data);
            }

            result = 0;
        }
        else if (strcmp(OPTION_TLS_VERSION, optionName) == 0)
        {
            if (tls_io_instance->ssl_context != NULL)
            {
                LogError("Unable to set the tls version after the tls connection is established");
                result = MU_FAILURE;
            }
            else
            {
                const int version_option = *(const int*)value;
                if (version_option == 0 || version_option == 10)
                {
                    tls_io_instance->tls_version = VERSION_1_0;
                }
                else if (version_option == 11)
                {
                    tls_io_instance->tls_version = VERSION_1_1;
                }
                else if (version_option == 12)
                {
                    tls_io_instance->tls_version = VERSION_1_2;
                }
                else
                {
                    LogInfo("Value of TLS version option %d is not found shall default to version 1.2", version_option);
                    tls_io_instance->tls_version = VERSION_1_2;
                }
                result = 0;
            }
        }
        else if (strcmp(optionName, OPTION_UNDERLYING_IO_OPTIONS) == 0)
        {
            if (OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value, (void*)tls_io_instance->underlying_io) != OPTIONHANDLER_OK)
            {
                LogError("failed feeding options to underlying I/O instance");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
        else if (strcmp(optionName, OPTION_SET_TLS_RENEGOTIATION) == 0)
        {
            // No need to do anything for Openssl
            result = 0;
        }
        else if (strcmp("ignore_host_name_check", optionName) == 0)
        {
            bool* server_name_check = (bool*)value;
            tls_io_instance->ignore_host_name_check = *server_name_check;
            result = 0;
        }
        else
        {
            if (tls_io_instance->underlying_io == NULL)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = xio_setoption(tls_io_instance->underlying_io, optionName, value);
            }
        }
    }

    return result;
}